

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.h
# Opt level: O0

String * __thiscall
capnp::TextCodec::encode<capnp::DynamicStruct::Reader>
          (String *__return_storage_ptr__,TextCodec *this,Reader *value)

{
  Reader *pRVar1;
  Reader local_a8;
  Reader local_68;
  Reader *local_20;
  Reader *value_local;
  TextCodec *this_local;
  
  local_20 = value;
  value_local = (Reader *)this;
  this_local = (TextCodec *)__return_storage_ptr__;
  pRVar1 = kj::fwd<capnp::DynamicStruct::Reader>(value);
  local_a8.reader.nestingLimit = (pRVar1->reader).nestingLimit;
  local_a8.reader._44_4_ = *(undefined4 *)&(pRVar1->reader).field_0x2c;
  local_a8.schema.super_Schema.raw = (Schema)(pRVar1->schema).super_Schema.raw;
  local_a8.reader.segment = (pRVar1->reader).segment;
  local_a8.reader.capTable = (pRVar1->reader).capTable;
  local_a8.reader.data = (pRVar1->reader).data;
  local_a8.reader.pointers = (pRVar1->reader).pointers;
  local_a8.reader.dataSize = (pRVar1->reader).dataSize;
  local_a8.reader.pointerCount = (pRVar1->reader).pointerCount;
  local_a8.reader._38_2_ = *(undefined2 *)&(pRVar1->reader).field_0x26;
  DynamicValue::Reader::Reader(&local_68,&local_a8);
  encode(__return_storage_ptr__,this,&local_68);
  DynamicValue::Reader::~Reader(&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline kj::String TextCodec::encode(T&& value) const {
  return encode(DynamicValue::Reader(ReaderFor<FromAny<T>>(kj::fwd<T>(value))));
}